

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O0

int Abc_NtkDontCareTransfer(Odc_Man_t *p)

{
  Odc_Lit_t OVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  void *pvVar4;
  int local_28;
  int i;
  uint uData;
  Odc_Lit_t uLit;
  Odc_Lit_t uRes1;
  Odc_Lit_t uRes0;
  Abc_Obj_t *pObj;
  Odc_Man_t *p_local;
  
  Abc_NtkIncrementTravId(p->pNode->pNtk);
  for (local_28 = 0; iVar2 = Vec_PtrSize(p->vLeaves), local_28 < iVar2; local_28 = local_28 + 1) {
    pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(p->vLeaves,local_28);
    OVar1 = Odc_Var(p,local_28);
    pAVar3->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)CONCAT22(OVar1,OVar1);
    Abc_NodeSetTravIdCurrent(pAVar3);
  }
  for (local_28 = 0; iVar2 = Vec_PtrSize(p->vBranches), local_28 < iVar2; local_28 = local_28 + 1) {
    pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(p->vBranches,local_28);
    OVar1 = Odc_Var(p,local_28 + p->nVarsMax);
    pAVar3->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)CONCAT22(OVar1,OVar1);
    Abc_NodeSetTravIdCurrent(pAVar3);
  }
  OVar1 = Odc_Const0();
  p->iRoot = OVar1;
  for (local_28 = 0; iVar2 = Vec_PtrSize(p->vRoots), local_28 < iVar2; local_28 = local_28 + 1) {
    pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(p->vRoots,local_28);
    pvVar4 = Abc_NtkDontCareTransfer_rec(p,pAVar3,p->pNode);
    OVar1 = Odc_Xor(p,(Odc_Lit_t)pvVar4,(Odc_Lit_t)((ulong)pvVar4 >> 0x10));
    OVar1 = Odc_Or(p,p->iRoot,OVar1);
    p->iRoot = OVar1;
  }
  return 1;
}

Assistant:

int Abc_NtkDontCareTransfer( Odc_Man_t * p )
{
    Abc_Obj_t * pObj;
    Odc_Lit_t uRes0, uRes1;
    Odc_Lit_t uLit;
    unsigned uData;
    int i;
    Abc_NtkIncrementTravId( p->pNode->pNtk );
    // set elementary variables at the leaves 
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vLeaves, pObj, i )
    {
        uLit = Odc_Var( p, i );
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)((uLit << 16) | uLit);
        Abc_NodeSetTravIdCurrent(pObj);
    }
    // set elementary variables at the branched 
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vBranches, pObj, i )
    {
        uLit = Odc_Var( p, i+p->nVarsMax );
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)((uLit << 16) | uLit);
        Abc_NodeSetTravIdCurrent(pObj);
    }
    // compute the AIG for the window
    p->iRoot = Odc_Const0();
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vRoots, pObj, i )
    {
        uData = (unsigned)(ABC_PTRUINT_T)Abc_NtkDontCareTransfer_rec( p, pObj, p->pNode );
        // get the cofactors
        uRes0 = uData & 0xffff;
        uRes1 = uData >> 16;
        // compute the miter
//        assert( uRes0 != uRes1 ); // may be false if the node is redundant w.r.t. this root
        uLit = Odc_Xor( p, uRes0, uRes1 );
        p->iRoot = Odc_Or( p, p->iRoot, uLit );
    }
    return 1;
}